

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NtkPrintSubraphSizes(Abc_Ntk_t *pNtk)

{
  int *piVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  Abc_Obj_t *pNode;
  int i;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
      pNode = Abc_NtkObj(pNtk,i);
      if (((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
         (1 < (pNode->vFanouts).nSize)) {
        iVar3 = Abc_NodeIsExorType(pNode);
        if (iVar3 == 0) {
          piVar1 = (pNode->vFanins).pArray;
          ppvVar2 = pNode->pNtk->vObjs->pArray;
          iVar3 = Abc_ObjSugraphSize((Abc_Obj_t *)ppvVar2[*piVar1]);
          iVar4 = Abc_ObjSugraphSize((Abc_Obj_t *)ppvVar2[piVar1[1]]);
          printf("%d(%d) ",(ulong)(iVar3 + iVar4 + 1),(ulong)(uint)(pNode->vFanouts).nSize);
        }
      }
    }
    putchar(10);
    return 1;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                ,0x767,"int Abc_NtkPrintSubraphSizes(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkPrintSubraphSizes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsExorType(pObj) )
            printf( "%d(%d) ", 1 + Abc_ObjSugraphSize(Abc_ObjFanin0(pObj)) + 
                Abc_ObjSugraphSize(Abc_ObjFanin1(pObj)), Abc_ObjFanoutNum(pObj) );
    printf( "\n" );
    return 1;
}